

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparateApprovedAndReceivedDirectoriesNamer.cpp
# Opt level: O0

void __thiscall
ApprovalTests::SeparateApprovedAndReceivedDirectoriesNamer::
SeparateApprovedAndReceivedDirectoriesNamer(SeparateApprovedAndReceivedDirectoriesNamer *this)

{
  undefined8 *in_RDI;
  string *in_stack_00000058;
  TemplatedCustomNamer *in_stack_00000060;
  string local_28 [40];
  
  separateDirectoryPath_abi_cxx11_();
  TemplatedCustomNamer::TemplatedCustomNamer(in_stack_00000060,in_stack_00000058);
  ::std::__cxx11::string::~string(local_28);
  *in_RDI = &PTR__SeparateApprovedAndReceivedDirectoriesNamer_002c5650;
  return;
}

Assistant:

SeparateApprovedAndReceivedDirectoriesNamer::
        SeparateApprovedAndReceivedDirectoriesNamer()
        : TemplatedCustomNamer(separateDirectoryPath())
    {
    }